

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

basic_substring<const_char> __thiscall
c4::basic_substring<const_char>::_first_integral_span
          (basic_substring<const_char> *this,size_t skip_start)

{
  char *s_;
  byte bVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  uint uVar5;
  basic_substring<const_char> bVar6;
  basic_substring<const_char> local_30;
  
  if (((char *)this->len == (char *)0x0) || (pcVar3 = (char *)this->len, this->str == (char *)0x0))
  {
    basic_substring<char_const>::_first_integral_span();
    pcVar3 = local_30.str;
  }
  if (pcVar3 == (char *)skip_start) {
    s_ = this->str;
LAB_001de3dc:
    pcVar3 = (char *)0x0;
    goto LAB_001de537;
  }
  if (pcVar3 <= skip_start) {
    basic_substring<char_const>::_first_integral_span();
    pcVar3 = local_30.str;
  }
  s_ = this->str;
  if ((char *)(skip_start + 3) <= pcVar3) {
    if (s_[skip_start] == '0') {
      bVar1 = s_[skip_start + 1] & 0xdf;
      if (bVar1 == 0x42) {
        pcVar4 = (char *)(skip_start + 2);
        pcVar2 = pcVar4;
        if (pcVar4 < pcVar3) {
          do {
            bVar1 = s_[(long)pcVar2];
            if ((bVar1 & 0xfe) != 0x30) {
              if ((pcVar2 <= pcVar4) ||
                 (((uVar5 = (uint)bVar1, 0x3b < bVar1 ||
                   ((0x800120100002601U >> ((ulong)uVar5 & 0x3f) & 1) == 0)) &&
                  ((uVar5 != 0x5d && (uVar5 != 0x7d)))))) goto LAB_001de3dc;
              basic_substring(&local_30,s_,(size_t)pcVar2);
              s_ = local_30.str;
              pcVar3 = (char *)local_30.len;
              break;
            }
            pcVar2 = pcVar2 + 1;
          } while (pcVar3 != pcVar2);
        }
        goto LAB_001de537;
      }
      if (bVar1 == 0x4f) {
        pcVar4 = (char *)(skip_start + 2);
        pcVar2 = pcVar4;
        if (pcVar4 < pcVar3) {
          do {
            bVar1 = s_[(long)pcVar2];
            if ((bVar1 & 0xf8) != 0x30) {
              if ((pcVar2 <= pcVar4) ||
                 (((uVar5 = (uint)bVar1, 0x3b < bVar1 ||
                   ((0x800120100002601U >> ((ulong)uVar5 & 0x3f) & 1) == 0)) &&
                  ((uVar5 != 0x5d && (uVar5 != 0x7d)))))) goto LAB_001de3dc;
              basic_substring(&local_30,s_,(size_t)pcVar2);
              s_ = local_30.str;
              pcVar3 = (char *)local_30.len;
              break;
            }
            pcVar2 = pcVar2 + 1;
          } while (pcVar3 != pcVar2);
        }
        goto LAB_001de537;
      }
      if (bVar1 == 0x58) {
        pcVar4 = (char *)(skip_start + 2);
        pcVar2 = pcVar4;
        if (pcVar4 < pcVar3) {
          do {
            bVar1 = s_[(long)pcVar2];
            if (9 < (byte)(bVar1 - 0x30)) {
              if ((0x25 < bVar1 - 0x41) ||
                 ((0x3f0000003fU >> ((ulong)(bVar1 - 0x41) & 0x3f) & 1) == 0)) {
                if ((pcVar2 <= pcVar4) ||
                   ((((0x3b < bVar1 || ((0x800120100002601U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) &&
                     (bVar1 != 0x5d)) && (bVar1 != 0x7d)))) goto LAB_001de3dc;
                basic_substring(&local_30,s_,(size_t)pcVar2);
                s_ = local_30.str;
                pcVar3 = (char *)local_30.len;
                break;
              }
            }
            pcVar2 = pcVar2 + 1;
          } while (pcVar3 != pcVar2);
        }
        goto LAB_001de537;
      }
    }
    else {
      pcVar2 = (char *)skip_start;
      if (skip_start < pcVar3) {
        do {
          bVar1 = s_[(long)pcVar2];
          if (9 < (byte)(bVar1 - 0x30)) {
            if ((pcVar2 <= skip_start) ||
               ((((0x3b < bVar1 || ((0x800120100002601U >> ((ulong)(uint)bVar1 & 0x3f) & 1) == 0))
                 && (bVar1 != 0x5d)) && (bVar1 != 0x7d)))) goto LAB_001de3dc;
            basic_substring(&local_30,s_,(size_t)pcVar2);
            s_ = local_30.str;
            pcVar3 = (char *)local_30.len;
            goto LAB_001de537;
          }
          pcVar2 = pcVar2 + 1;
        } while (pcVar3 != pcVar2);
      }
    }
  }
  pcVar2 = (char *)skip_start;
  if (skip_start < pcVar3) {
    do {
      bVar1 = s_[(long)pcVar2];
      if (9 < (byte)(bVar1 - 0x30)) {
        if ((pcVar2 <= skip_start) ||
           (((0x3b < bVar1 || ((0x800120100002601U >> ((ulong)(uint)bVar1 & 0x3f) & 1) == 0)) &&
            ((bVar1 != 0x5d && (bVar1 != 0x7d)))))) goto LAB_001de3dc;
        basic_substring(&local_30,s_,(size_t)pcVar2);
        s_ = local_30.str;
        pcVar3 = (char *)local_30.len;
        break;
      }
      pcVar2 = pcVar2 + 1;
    } while (pcVar3 != pcVar2);
  }
LAB_001de537:
  bVar6.len = (size_t)pcVar3;
  bVar6.str = s_;
  return bVar6;
}

Assistant:

basic_substring _first_integral_span(size_t skip_start) const
    {
        C4_ASSERT(!empty());
        if(skip_start == len)
            return first(0);
        C4_ASSERT(skip_start < len);
        if(len >= skip_start + 3)
        {
            if(str[skip_start] != '0')
            {
                for(size_t i = skip_start; i < len; ++i)
                {
                    char c = str[i];
                    if(c < '0' || c > '9')
                        return i > skip_start && _is_delim_char(c) ? first(i) : first(0);
                }
            }
            else
            {
                char next = str[skip_start + 1];
                if(next == 'x' || next == 'X')
                {
                    skip_start += 2;
                    for(size_t i = skip_start; i < len; ++i)
                    {
                        const char c = str[i];
                        if( ! _is_hex_char(c))
                            return i > skip_start && _is_delim_char(c) ? first(i) : first(0);
                    }
                    return *this;
                }
                else if(next == 'b' || next == 'B')
                {
                    skip_start += 2;
                    for(size_t i = skip_start; i < len; ++i)
                    {
                        const char c = str[i];
                        if(c != '0' && c != '1')
                            return i > skip_start && _is_delim_char(c) ? first(i) : first(0);
                    }
                    return *this;
                }
                else if(next == 'o' || next == 'O')
                {
                    skip_start += 2;
                    for(size_t i = skip_start; i < len; ++i)
                    {
                        const char c = str[i];
                        if(c < '0' || c > '7')
                            return i > skip_start && _is_delim_char(c) ? first(i) : first(0);
                    }
                    return *this;
                }
            }
        }
        // must be a decimal, or it is not a an number
        for(size_t i = skip_start; i < len; ++i)
        {
            const char c = str[i];
            if(c < '0' || c > '9')
                return i > skip_start && _is_delim_char(c) ? first(i) : first(0);
        }
        return *this;
    }